

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

bool __thiscall
spvtools::val::ValidationState_t::IsFloat16Vector2Or4Type(ValidationState_t *this,uint32_t id)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined8 in_RAX;
  const_iterator cVar3;
  uint32_t local_28;
  uint32_t local_24;
  
  _local_28 = CONCAT44((uint32_t)((ulong)in_RAX >> 0x20),id);
  cVar3 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->all_definitions_)._M_h,&local_28);
  if ((cVar3.
       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
       ._M_cur == (__node_type *)0x0) ||
     (*(long *)((long)cVar3.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                      ._M_cur + 0x10) == 0)) {
    __assert_fail("inst",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x3d6,
                  "bool spvtools::val::ValidationState_t::IsFloat16Vector2Or4Type(uint32_t) const");
  }
  if (*(short *)(*(long *)((long)cVar3.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                 ._M_cur + 0x10) + 0x3a) == 0x17) {
    uVar1 = GetDimension(this,id);
    uVar2 = GetComponentType(this,id);
    _local_28 = CONCAT44(uVar2,local_28);
    cVar3 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->all_definitions_)._M_h,&local_24);
    if ((((cVar3.
           super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
           ._M_cur != (__node_type *)0x0) &&
         (*(long *)((long)cVar3.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                          ._M_cur + 0x10) != 0)) &&
        (*(short *)(*(long *)((long)cVar3.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                    ._M_cur + 0x10) + 0x3a) == 0x16)) &&
       ((uVar1 == 4 || (uVar1 == 2)))) {
      uVar1 = GetComponentType(this,id);
      uVar1 = GetBitWidth(this,uVar1);
      return uVar1 == 0x10;
    }
  }
  return false;
}

Assistant:

bool ValidationState_t::IsFloat16Vector2Or4Type(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  assert(inst);

  if (inst->opcode() == spv::Op::OpTypeVector) {
    uint32_t vectorDim = GetDimension(id);
    return IsFloatScalarType(GetComponentType(id)) &&
           (vectorDim == 2 || vectorDim == 4) &&
           (GetBitWidth(GetComponentType(id)) == 16);
  }

  return false;
}